

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O0

UBool isFollowedByCasedLetter(UCaseContextIterator *iter,void *context,int8_t dir)

{
  UChar32 c_00;
  uint uVar1;
  int32_t type;
  UChar32 c;
  int8_t dir_local;
  void *context_local;
  UCaseContextIterator *iter_local;
  
  type._3_1_ = dir;
  if (iter != (UCaseContextIterator *)0x0) {
    while (c_00 = (*iter)(context,type._3_1_), -1 < c_00) {
      uVar1 = ucase_getTypeOrIgnorable_63(c_00);
      if ((uVar1 & 4) == 0) {
        if (uVar1 == 0) {
          return '\0';
        }
        return '\x01';
      }
      type._3_1_ = '\0';
    }
  }
  return '\0';
}

Assistant:

static UBool
isFollowedByCasedLetter(UCaseContextIterator *iter, void *context, int8_t dir) {
    UChar32 c;

    if(iter==NULL) {
        return FALSE;
    }

    for(/* dir!=0 sets direction */; (c=iter(context, dir))>=0; dir=0) {
        int32_t type=ucase_getTypeOrIgnorable(c);
        if(type&4) {
            /* case-ignorable, continue with the loop */
        } else if(type!=UCASE_NONE) {
            return TRUE; /* followed by cased letter */
        } else {
            return FALSE; /* uncased and not case-ignorable */
        }
    }

    return FALSE; /* not followed by cased letter */
}